

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O2

double delaunator::sum(vector<double,_std::allocator<double>_> *x)

{
  double dVar1;
  pointer pdVar2;
  size_t i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar4 = 0.0;
  dVar5 = *pdVar2;
  for (uVar3 = 1;
      uVar3 < (ulong)((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      uVar3 = uVar3 + 1) {
    dVar1 = pdVar2[uVar3];
    dVar6 = dVar5 + dVar1;
    dVar4 = dVar4 + (double)(~-(ulong)(ABS(dVar5) < ABS(dVar1)) & (ulong)((dVar5 - dVar6) + dVar1) |
                            (ulong)((dVar1 - dVar6) + dVar5) & -(ulong)(ABS(dVar5) < ABS(dVar1)));
    dVar5 = dVar6;
  }
  return dVar4 + dVar5;
}

Assistant:

inline double sum(const std::vector<double>& x) {
    double sum = x[0];
    double err = 0.0;

    for (size_t i = 1; i < x.size(); i++) {
        const double k = x[i];
        const double m = sum + k;
        err += std::fabs(sum) >= std::fabs(k) ? sum - m + k : k - m + sum;
        sum = m;
    }
    return sum + err;
}